

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

substr __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::emit_as(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,EmitType_e type,Tree *t,size_t id,bool error_on_excess)

{
  pfn_error p_Var1;
  code *pcVar2;
  undefined1 auVar3 [16];
  Location LVar4;
  Location LVar5;
  Location LVar6;
  bool bVar7;
  error_flags eVar8;
  ulong uVar9;
  substr sVar10;
  csubstr cVar11;
  char msg [27];
  char *pcStack_88;
  size_t local_80;
  char *pcStack_60;
  size_t local_58;
  char *pcStack_38;
  size_t local_30;
  
  if (t->m_size == 0) {
    if (id != 0xffffffffffffffff) {
      builtin_strncpy(msg + 0x10,"d == NONE)",0xb);
      builtin_strncpy(msg,"check failed: (i",0x10);
      eVar8 = get_error_flags();
      if ((eVar8 & 1) != 0) {
        bVar7 = is_debugger_attached();
        if (bVar7) {
          pcVar2 = (code *)swi(3);
          sVar10 = (substr)(*pcVar2)();
          return sVar10;
        }
      }
      p_Var1 = (t->m_callbacks).m_error;
      cVar11 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_30 = cVar11.len;
      pcStack_38 = cVar11.str;
      LVar5.super_LineCol.col = 0;
      LVar5.super_LineCol.offset = SUB168(ZEXT816(0x581c) << 0x40,0);
      LVar5.super_LineCol.line = SUB168(ZEXT816(0x581c) << 0x40,8);
      LVar5.name.str = pcStack_38;
      LVar5.name.len = local_30;
      (*p_Var1)(msg,0x1b,LVar5,(t->m_callbacks).m_user_data);
    }
    uVar9 = 0;
  }
  else {
    if (t->m_size <= id) {
      builtin_strncpy(msg + 0x10," < t.size()",0xb);
      builtin_strncpy(msg,"check failed: id",0x10);
      eVar8 = get_error_flags();
      if ((eVar8 & 1) != 0) {
        bVar7 = is_debugger_attached();
        if (bVar7) {
          pcVar2 = (code *)swi(3);
          sVar10 = (substr)(*pcVar2)();
          return sVar10;
        }
      }
      p_Var1 = (t->m_callbacks).m_error;
      cVar11 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_58 = cVar11.len;
      pcStack_60 = cVar11.str;
      LVar4.super_LineCol.col = 0;
      LVar4.super_LineCol.offset = SUB168(ZEXT816(0x581f) << 0x40,0);
      LVar4.super_LineCol.line = SUB168(ZEXT816(0x581f) << 0x40,8);
      LVar4.name.str = pcStack_60;
      LVar4.name.len = local_58;
      (*p_Var1)(msg,0x1c,LVar4,(t->m_callbacks).m_user_data);
    }
    this->m_tree = t;
    if (type == EMIT_JSON) {
      _do_visit_json(this,id);
    }
    else if (type == EMIT_YAML) {
      _emit_yaml(this,id);
    }
    else {
      builtin_strncpy(msg,"unknown emit type",0x12);
      eVar8 = get_error_flags();
      if ((eVar8 & 1) != 0) {
        bVar7 = is_debugger_attached();
        if (bVar7) {
          pcVar2 = (code *)swi(3);
          sVar10 = (substr)(*pcVar2)();
          return sVar10;
        }
      }
      p_Var1 = (this->m_tree->m_callbacks).m_error;
      cVar11 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_80 = cVar11.len;
      pcStack_88 = cVar11.str;
      LVar6.super_LineCol.col = 0;
      LVar6.super_LineCol.offset = SUB168(ZEXT816(0x5826) << 0x40,0);
      LVar6.super_LineCol.line = SUB168(ZEXT816(0x5826) << 0x40,8);
      LVar6.name.str = pcStack_88;
      LVar6.name.len = local_80;
      (*p_Var1)(msg,0x12,LVar6,(this->m_tree->m_callbacks).m_user_data);
    }
    uVar9 = (this->
            super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).m_pos;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar9;
  return (substr)(auVar3 << 0x40);
}

Assistant:

substr Emitter<Writer>::emit_as(EmitType_e type, Tree const& t, size_t id, bool error_on_excess)
{
    if(t.empty())
    {
        _RYML_CB_ASSERT(t.callbacks(), id == NONE);
        return {};
    }
    _RYML_CB_CHECK(t.callbacks(), id < t.size());
    m_tree = &t;
    if(type == EMIT_YAML)
        _emit_yaml(id);
    else if(type == EMIT_JSON)
        _do_visit_json(id);
    else
        _RYML_CB_ERR(m_tree->callbacks(), "unknown emit type");
    return this->Writer::_get(error_on_excess);
}